

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dpmr.cpp
# Opt level: O1

int __thiscall DSDcc::DSDdPMR::init(DSDdPMR *this,EVP_PKEY_CTX *ctx)

{
  this->m_syncCycle = 0;
  this->m_symbolIndex = 0;
  this->m_colourCode = 0;
  this->m_ownId = 0;
  this->m_frameNumber = 0xff;
  this->m_headerType = DPMRUndefinedHeader;
  this->m_commMode = DPMRUndefinedMode;
  this->m_commFormat = DPMRUndefinedFormat;
  this->m_calledId = 0;
  this->m_state = DPMRHeader;
  this->m_frameType = DPMRNoFrame;
  return 0;
}

Assistant:

void DSDdPMR::init()
{
    m_syncCycle = 0;
    m_symbolIndex = 0;
    m_colourCode = 0;
    m_calledId = 0;
    m_ownId = 0;
    m_frameNumber = 0xFF;
    m_headerType = DPMRUndefinedHeader;
    m_commMode = DPMRUndefinedMode;
    m_commFormat = DPMRUndefinedFormat;
    m_frameType = DPMRNoFrame;
    m_state = DPMRHeader;
}